

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtreewidget.cpp
# Opt level: O2

void QTreeWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  ScrollHint hint;
  QTreeWidgetItem *item;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      itemPressed((QTreeWidget *)_o,*_a[1],*_a[2]);
      return;
    case 1:
      itemClicked((QTreeWidget *)_o,*_a[1],*_a[2]);
      return;
    case 2:
      itemDoubleClicked((QTreeWidget *)_o,*_a[1],*_a[2]);
      return;
    case 3:
      itemActivated((QTreeWidget *)_o,*_a[1],*_a[2]);
      return;
    case 4:
      itemEntered((QTreeWidget *)_o,*_a[1],*_a[2]);
      return;
    case 5:
      itemChanged((QTreeWidget *)_o,*_a[1],*_a[2]);
      return;
    case 6:
      itemExpanded((QTreeWidget *)_o,*_a[1]);
      return;
    case 7:
      itemCollapsed((QTreeWidget *)_o,*_a[1]);
      return;
    case 8:
      currentItemChanged((QTreeWidget *)_o,*_a[1],*_a[2]);
      return;
    case 9:
      itemSelectionChanged((QTreeWidget *)_o);
      return;
    case 10:
      item = *_a[1];
      hint = *_a[2];
      break;
    case 0xb:
      item = *_a[1];
      hint = EnsureVisible;
      break;
    case 0xc:
      expandItem((QTreeWidget *)_o,*_a[1]);
      return;
    case 0xd:
      collapseItem((QTreeWidget *)_o,*_a[1]);
      return;
    case 0xe:
      clear((QTreeWidget *)_o);
      return;
    default:
      goto switchD_00552f6f_caseD_3;
    }
    scrollToItem((QTreeWidget *)_o,item,hint);
    return;
  case ReadProperty:
    piVar1 = (int *)*_a;
    if (_id == 1) {
      iVar3 = topLevelItemCount((QTreeWidget *)_o);
    }
    else {
      if (_id != 0) {
        return;
      }
      iVar3 = columnCount((QTreeWidget *)_o);
    }
    *piVar1 = iVar3;
    break;
  case WriteProperty:
    if (_id == 0) {
      setColumnCount((QTreeWidget *)_o,**_a);
      return;
    }
    break;
  case IndexOfMethod:
    bVar2 = QtMocHelpers::indexOfMethod<void(QTreeWidget::*)(QTreeWidgetItem*,int)>
                      ((QtMocHelpers *)_a,(void **)itemPressed,0,0);
    if ((((((!bVar2) &&
           (bVar2 = QtMocHelpers::indexOfMethod<void(QTreeWidget::*)(QTreeWidgetItem*,int)>
                              ((QtMocHelpers *)_a,(void **)itemClicked,0,1), !bVar2)) &&
          (bVar2 = QtMocHelpers::indexOfMethod<void(QTreeWidget::*)(QTreeWidgetItem*,int)>
                             ((QtMocHelpers *)_a,(void **)itemDoubleClicked,0,2), !bVar2)) &&
         ((bVar2 = QtMocHelpers::indexOfMethod<void(QTreeWidget::*)(QTreeWidgetItem*,int)>
                             ((QtMocHelpers *)_a,(void **)itemActivated,0,3), !bVar2 &&
          (bVar2 = QtMocHelpers::indexOfMethod<void(QTreeWidget::*)(QTreeWidgetItem*,int)>
                             ((QtMocHelpers *)_a,(void **)itemEntered,0,4), !bVar2)))) &&
        ((bVar2 = QtMocHelpers::indexOfMethod<void(QTreeWidget::*)(QTreeWidgetItem*,int)>
                            ((QtMocHelpers *)_a,(void **)itemChanged,0,5), !bVar2 &&
         ((bVar2 = QtMocHelpers::indexOfMethod<void(QTreeWidget::*)(QTreeWidgetItem*)>
                             ((QtMocHelpers *)_a,(void **)itemExpanded,0,6), !bVar2 &&
          (bVar2 = QtMocHelpers::indexOfMethod<void(QTreeWidget::*)(QTreeWidgetItem*)>
                             ((QtMocHelpers *)_a,(void **)itemCollapsed,0,7), !bVar2)))))) &&
       (bVar2 = QtMocHelpers::indexOfMethod<void(QTreeWidget::*)(QTreeWidgetItem*,QTreeWidgetItem*)>
                          ((QtMocHelpers *)_a,(void **)currentItemChanged,0,8), !bVar2)) {
      QtMocHelpers::indexOfMethod<void(QTreeWidget::*)()>
                ((QtMocHelpers *)_a,(void **)itemSelectionChanged,0,9);
      return;
    }
  }
switchD_00552f6f_caseD_3:
  return;
}

Assistant:

void QTreeWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTreeWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->itemPressed((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 1: _t->itemClicked((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 2: _t->itemDoubleClicked((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 3: _t->itemActivated((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 4: _t->itemEntered((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 5: _t->itemChanged((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 6: _t->itemExpanded((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1]))); break;
        case 7: _t->itemCollapsed((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1]))); break;
        case 8: _t->currentItemChanged((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[2]))); break;
        case 9: _t->itemSelectionChanged(); break;
        case 10: _t->scrollToItem((*reinterpret_cast< std::add_pointer_t<const QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemView::ScrollHint>>(_a[2]))); break;
        case 11: _t->scrollToItem((*reinterpret_cast< std::add_pointer_t<const QTreeWidgetItem*>>(_a[1]))); break;
        case 12: _t->expandItem((*reinterpret_cast< std::add_pointer_t<const QTreeWidgetItem*>>(_a[1]))); break;
        case 13: _t->collapseItem((*reinterpret_cast< std::add_pointer_t<const QTreeWidgetItem*>>(_a[1]))); break;
        case 14: _t->clear(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , int )>(_a, &QTreeWidget::itemPressed, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , int )>(_a, &QTreeWidget::itemClicked, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , int )>(_a, &QTreeWidget::itemDoubleClicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , int )>(_a, &QTreeWidget::itemActivated, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , int )>(_a, &QTreeWidget::itemEntered, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , int )>(_a, &QTreeWidget::itemChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * )>(_a, &QTreeWidget::itemExpanded, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * )>(_a, &QTreeWidget::itemCollapsed, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , QTreeWidgetItem * )>(_a, &QTreeWidget::currentItemChanged, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)()>(_a, &QTreeWidget::itemSelectionChanged, 9))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->columnCount(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->topLevelItemCount(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setColumnCount(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}